

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

Pseudo * linearize_expression(Proc *proc,AstNode *expr)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  UnaryOperatorType op;
  BinaryOperatorType op_00;
  C_MemoryAllocator *pCVar4;
  undefined1 *puVar5;
  Pseudo *target;
  void *pvVar6;
  Constant *pCVar7;
  uint *puVar8;
  AstNode *pAVar9;
  Pseudo *pPVar10;
  Pseudo *pPVar11;
  char *pcVar12;
  Pseudo *pPVar13;
  byte *ptr;
  Pseudo *pPVar14;
  AstNode *pAVar15;
  AstNode *expr_00;
  Instruction *insn;
  LinearizerState *pLVar16;
  char cVar17;
  uint uVar18;
  _Bool is_and;
  char *__format;
  CompilerState *pCVar19;
  byte bVar20;
  ravitype_t rVar21;
  opcode oVar22;
  opcode oVar23;
  char *__s;
  ravitype_t rVar24;
  ravitype_t rVar25;
  ulong uVar26;
  bool bVar27;
  Pseudo *local_c8;
  int local_bc;
  int local_ac;
  Constant local_a8;
  PtrListIterator local_98 [4];
  
  switch(expr->type) {
  case EXPR_LITERAL:
    rVar24 = (expr->field_2).common_expr.type.type_code;
    if (rVar24 < RAVI_TNUMFLT) {
      if (rVar24 == RAVI_TNIL) {
        pCVar4 = proc->linearizer->compiler_state->allocator;
        target = (Pseudo *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
        uVar18 = *(uint *)target & 0xfffffff0 | 7;
      }
      else {
        if (rVar24 != RAVI_TBOOLEAN) {
          if (rVar24 == RAVI_TNUMINT) goto LAB_0011a336;
          goto switchD_00119b4a_caseD_13;
        }
        pAVar9 = (expr->field_2).function_stmt.function_expr;
        pCVar4 = proc->linearizer->compiler_state->allocator;
        target = (Pseudo *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
        uVar18 = (pAVar9 == (AstNode *)0x0) + 8 + (*(uint *)target & 0xfffffff0);
      }
      *(uint *)target = uVar18;
      (target->field_3).proc = proc;
      goto LAB_0011a3a5;
    }
    if ((rVar24 == RAVI_TNUMFLT) || (rVar24 == RAVI_TSTRING)) {
LAB_0011a336:
      pCVar7 = allocate_constant(proc,expr);
      pCVar4 = proc->linearizer->compiler_state->allocator;
      target = (Pseudo *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
      uVar18 = *(uint *)target;
      *(uint *)target = uVar18 & 0xfffffff0 | 5;
      (target->field_3).constant = pCVar7;
      *(uint *)target = uVar18 & 0xfff00000 | 5 | (uint)pCVar7->index << 4;
      goto LAB_0011a3a5;
    }
    if (rVar24 != RAVI_TVARARGS) goto switchD_00119b4a_caseD_13;
    pLVar16 = proc->linearizer;
    __s = "Var args not supported";
LAB_0011aad1:
    pCVar19 = pLVar16->compiler_state;
    goto LAB_0011ab03;
  case EXPR_SYMBOL:
    target = linearize_symbol_expression(proc,expr);
    break;
  case EXPR_Y_INDEX:
  case EXPR_FIELD_SELECTOR:
    target = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    break;
  default:
switchD_00119b4a_caseD_13:
    pLVar16 = proc->linearizer;
LAB_0011aaf9:
    pCVar19 = pLVar16->compiler_state;
    __s = "feature not yet implemented";
LAB_0011ab03:
    raviX_buffer_add_string(&pCVar19->error_message,__s);
    longjmp((__jmp_buf_tag *)pCVar19->env,1);
  case EXPR_SUFFIXED:
    target = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    pAVar9 = (expr->field_2).function_stmt.function_expr;
    raviX_ptrlist_forward_iterator(local_98,(PtrList *)(expr->field_2).for_stmt.for_statement_list);
    pAVar15 = (AstNode *)raviX_ptrlist_iter_next(local_98);
    if (pAVar15 != (AstNode *)0x0) {
      do {
        expr_00 = pAVar15;
        uVar18 = *(uint *)target & 0xf;
        if (uVar18 == 0xe) {
          target = indexed_load(proc,target);
        }
        else if (uVar18 == 0xb) {
          if ((target->field_3).range_in_use != 0) goto LAB_0011aa88;
          *(uint *)target = *(uint *)target & 0xfffffff0 | 4;
        }
        if (expr_00->type - EXPR_Y_INDEX < 2) {
          pPVar13 = linearize_expression(proc,(expr_00->field_2).function_stmt.function_expr);
          rVar24 = ((expr_00->field_2).function_call_expr.method_name)->hash;
          if (((undefined1  [48])*pPVar13 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
            pPVar13 = indexed_load(proc,pPVar13);
          }
          target = create_indexed_pseudo
                             (proc,(pAVar9->field_2).common_expr.type.type_code,target,rVar24,
                              pPVar13,(expr_00->field_2).common_expr.type.type_code,
                              expr->line_number);
        }
        else {
          if (expr_00->type != EXPR_FUNCTION_CALL) {
            pLVar16 = proc->linearizer;
            __s = "Unexpected expr type in suffix list";
            goto LAB_0011aad1;
          }
          target = linearize_function_call_expression(proc,expr_00,pAVar9,target);
        }
        pAVar15 = (AstNode *)raviX_ptrlist_iter_next(local_98);
        pAVar9 = expr_00;
      } while (pAVar15 != (AstNode *)0x0);
    }
    break;
  case EXPR_UNARY:
    op = (expr->field_2).unary_expr.unary_op;
    rVar24 = ((expr->field_2).function_call_expr.method_name)->hash;
    if (op - UNOPR_MINUS < 4) {
      rVar21 = RAVI_TANY;
      if (op - UNOPR_BNOT < 2) goto LAB_0011a235;
      if (op == UNOPR_LEN) {
        local_c8 = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
        target = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
        goto LAB_0011a547;
      }
      if (op != UNOPR_MINUS) goto LAB_0011a225;
      local_c8 = allocate_temp_pseudo(proc,rVar24,true);
      target = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
LAB_0011a27a:
      bVar20 = 0x2c;
      if (rVar24 != RAVI_TNUMINT) {
        bVar20 = (rVar24 == RAVI_TNUMFLT) * '\x02' + 0x2b;
      }
      goto LAB_0011a5a4;
    }
    if ((op == UNOPR_TO_INTEGER && rVar24 != RAVI_TNUMINT) ||
       (op == UNOPR_TO_NUMBER && rVar24 != RAVI_TNUMFLT)) {
LAB_0011a225:
      rVar21 = (uint)(op != UNOPR_TO_INTEGER) * 8 + RAVI_TNUMINT;
LAB_0011a235:
      local_c8 = allocate_temp_pseudo(proc,rVar21,true);
    }
    else {
      local_c8 = (Pseudo *)0x0;
    }
    target = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    switch(op - UNOPR_MINUS) {
    case 0:
      goto LAB_0011a27a;
    case 1:
      bVar20 = 0x39;
      goto LAB_0011a5a4;
    case 2:
      bVar20 = 0x38;
      goto LAB_0011a5a4;
    case 3:
LAB_0011a547:
      bVar20 = ((rVar24 + ~(RAVI_TNUMBER|RAVI_TBOOLEAN) & 0xffffffdfU) == 0U) + 0x2e;
      goto LAB_0011a5a4;
    case 4:
      bVar20 = 0x30;
      bVar27 = rVar24 == RAVI_TNUMINT;
      break;
    case 5:
      bVar20 = 0x31;
      bVar27 = rVar24 == RAVI_TNUMFLT;
      break;
    case 6:
      bVar20 = 0x34;
      bVar27 = rVar24 == RAVI_TARRAYINT;
      break;
    case 7:
      bVar20 = 0x35;
      bVar27 = rVar24 == RAVI_TARRAYFLT;
      break;
    case 8:
      bVar20 = 0x36;
      bVar27 = rVar24 == RAVI_TTABLE;
      break;
    case 9:
      bVar20 = 0x33;
      bVar27 = rVar24 == RAVI_TSTRING;
      break;
    case 10:
      bVar20 = 0x32;
      bVar27 = rVar24 == RAVI_TFUNCTION;
      break;
    case 0xb:
      bVar20 = 0x37;
      goto LAB_0011a5a4;
    default:
      pcVar12 = raviX_get_unary_opr_str(op);
      __format = "unexpected unary op %s";
LAB_0011ab40:
      __s = (char *)local_98;
      snprintf(__s,100,__format,pcVar12);
      pLVar16 = proc->linearizer;
      goto LAB_0011aad1;
    }
    if (!bVar27) {
LAB_0011a5a4:
      uVar18 = expr->line_number;
      pCVar4 = proc->linearizer->compiler_state->allocator;
      insn = (Instruction *)(*pCVar4->calloc)(pCVar4->arena,1,0x28);
      *(byte *)insn = bVar20;
      insn->line_number = uVar18;
      if (op == UNOPR_TO_TYPE) {
        local_98[0].__list = (PtrList *)(expr->field_2).goto_stmt.name;
        local_98[0].__head._0_4_ = 0x101;
        pCVar7 = add_constant(proc,(Constant *)local_98);
        pCVar4 = proc->linearizer->compiler_state->allocator;
        puVar8 = (uint *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
        uVar18 = *puVar8;
        *puVar8 = uVar18 & 0xfffffff0 | 5;
        *(Constant **)(puVar8 + 2) = pCVar7;
        *puVar8 = uVar18 & 0xfff00000 | 5 | (uint)pCVar7->index << 4;
        raviX_ptrlist_add((PtrList **)&insn->operands,puVar8,
                          proc->linearizer->compiler_state->allocator);
        pPVar13 = (Pseudo *)0x0;
      }
      else if (((op - UNOPR_BNOT < 2) || (op == UNOPR_LEN)) || (op == UNOPR_MINUS)) {
        pPVar13 = add_instruction_operand(proc,insn,target);
        free_temp_pseudo(proc,target,false);
        target = local_c8;
      }
      else {
        pPVar13 = (Pseudo *)0x0;
      }
      uVar18 = *(uint *)target;
      if ((uVar18 & 0xf) == 0xe) {
        target = indexed_load(proc,target);
        uVar18 = *(uint *)target;
      }
      if ((uVar18 & 0xf) == 0xe) {
LAB_0011aa4a:
        __assert_fail("pseudo->type != PSEUDO_INDEXED",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
      }
      raviX_ptrlist_add((PtrList **)&insn->targets,target,
                        proc->linearizer->compiler_state->allocator);
      if (insn->block != proc->current_bb && insn->block != (BasicBlock *)0x0) {
LAB_0011aa69:
        __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x1b1,"void add_instruction(Proc *, Instruction *)");
      }
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,insn,
                        proc->linearizer->compiler_state->allocator);
      insn->block = proc->current_bb;
      if (pPVar13 != (Pseudo *)0x0) {
        free_temp_pseudo(proc,pPVar13,false);
      }
      if ((bVar20 & 0xfe) == 0x30) {
        uVar18 = expr->line_number;
        pCVar4 = proc->linearizer->compiler_state->allocator;
        puVar5 = (undefined1 *)(*pCVar4->calloc)(pCVar4->arena,1,0x28);
        *puVar5 = 0x4a;
        *(uint *)(puVar5 + 0x20) = uVar18;
        if (((undefined1  [48])*target & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
          pPVar11 = indexed_load(proc,target);
          pPVar13 = pPVar11;
        }
        else {
          pPVar11 = (Pseudo *)0x0;
          pPVar13 = target;
        }
        raviX_ptrlist_add((PtrList **)(puVar5 + 8),pPVar13,
                          proc->linearizer->compiler_state->allocator);
        free_temp_pseudo(proc,target,false);
        if (((undefined1  [48])*local_c8 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
        goto LAB_0011aa4a;
        raviX_ptrlist_add((PtrList **)(puVar5 + 0x10),local_c8,
                          proc->linearizer->compiler_state->allocator);
        if (*(BasicBlock **)(puVar5 + 0x18) != proc->current_bb &&
            *(BasicBlock **)(puVar5 + 0x18) != (BasicBlock *)0x0) goto LAB_0011aa69;
        raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,puVar5,
                          proc->linearizer->compiler_state->allocator);
        *(BasicBlock **)(puVar5 + 0x18) = proc->current_bb;
        target = local_c8;
LAB_0011a822:
        if (pPVar11 != (Pseudo *)0x0) {
          free_temp_pseudo(proc,pPVar11,false);
        }
      }
      goto LAB_0011a3a5;
    }
    break;
  case EXPR_BINARY:
    op_00 = (expr->field_2).binary_expr.binary_op;
    if (op_00 == BINOPR_OR) {
      is_and = false;
LAB_0011a38e:
      target = linearize_bool(proc,expr,is_and);
      break;
    }
    if (op_00 == BINOPR_AND) {
      is_and = true;
      goto LAB_0011a38e;
    }
    rVar24 = (expr->field_2).common_expr.type.type_code;
    if (op_00 == BINOPR_NE) {
      pPVar13 = allocate_temp_pseudo(proc,rVar24,true);
    }
    else {
      pPVar13 = (Pseudo *)0x0;
    }
    target = allocate_temp_pseudo(proc,rVar24,true);
    pAVar9 = (expr->field_2).function_stmt.function_expr;
    pAVar15 = (expr->field_2).binary_expr.expr_right;
    pPVar11 = linearize_expression(proc,pAVar9);
    pPVar14 = linearize_expression(proc,pAVar15);
    pPVar10 = pPVar14;
    switch(op_00) {
    case BINOPR_ADD:
      oVar22 = op_add;
      goto LAB_0011a8a8;
    case BINOPR_SUB:
      oVar22 = op_sub;
      break;
    case BINOPR_MUL:
      oVar22 = op_mul;
LAB_0011a8a8:
      rVar21 = (pAVar9->field_2).common_expr.type.type_code;
      rVar25 = (pAVar15->field_2).common_expr.type.type_code;
      if (rVar25 == RAVI_TNUMFLT && rVar21 == RAVI_TNUMINT) {
        rVar24 = RAVI_TNUMFLT;
        rVar21 = RAVI_TNUMINT;
LAB_0011a8cf:
        pPVar10 = pPVar11;
        pPVar11 = pPVar14;
        rVar25 = rVar21;
        rVar21 = rVar24;
      }
      goto LAB_0011a910;
    case BINOPR_MOD:
      oVar22 = op_mod;
      break;
    case BINOPR_POW:
      oVar22 = op_pow;
      break;
    case BINOPR_DIV:
      oVar22 = op_div;
      break;
    case BINOPR_IDIV:
      oVar22 = op_idiv;
      break;
    case BINOPR_BAND:
      oVar22 = op_band;
      break;
    case BINOPR_BOR:
      oVar22 = op_bor;
      break;
    case BINOPR_BXOR:
      oVar22 = op_bxor;
      break;
    case BINOPR_SHL:
      oVar22 = op_shl;
      break;
    case BINOPR_SHR:
      oVar22 = op_shr;
      break;
    case BINOPR_CONCAT:
      oVar22 = op_concat;
      break;
    case BINOPR_EQ:
    case BINOPR_NE:
      oVar22 = op_eq;
      break;
    case BINOPR_LT:
    case BINOPR_GT:
      oVar22 = op_lt;
      goto LAB_0011a851;
    case BINOPR_LE:
    case BINOPR_GE:
      oVar22 = op_le;
LAB_0011a851:
      rVar24 = (pAVar15->field_2).common_expr.type.type_code;
      rVar21 = (pAVar9->field_2).common_expr.type.type_code;
      rVar25 = rVar24;
      if (op_00 - BINOPR_GT < 2) goto LAB_0011a8cf;
      goto LAB_0011a910;
    default:
      pcVar12 = raviX_get_binary_opr_str(op_00);
      __format = "unexpected binary op %s";
      goto LAB_0011ab40;
    }
    rVar21 = (pAVar9->field_2).common_expr.type.type_code;
    rVar25 = (pAVar15->field_2).common_expr.type.type_code;
LAB_0011a910:
    oVar23 = oVar22;
    if (oVar22 < op_div) {
      if (oVar22 == op_add) {
LAB_0011a981:
        if ((rVar21 != RAVI_TNUMFLT) || (rVar25 != RAVI_TNUMFLT)) {
          if ((rVar21 != RAVI_TNUMFLT) || (rVar25 != RAVI_TNUMINT)) {
            oVar23 = oVar22 + op_addff;
            rVar25 = rVar21 ^ RAVI_TNUMINT | rVar25 ^ RAVI_TNUMINT;
            goto LAB_0011a9a4;
          }
LAB_0011a9cb:
          oVar23 = oVar22 + op_add;
          goto LAB_0011a9ce;
        }
      }
      else {
        if (oVar22 != op_sub) {
          if (oVar22 != op_mul) goto LAB_0011a9ce;
          goto LAB_0011a981;
        }
LAB_0011a9b1:
        if ((rVar21 != RAVI_TNUMFLT) || (rVar25 != RAVI_TNUMFLT)) {
          if ((rVar21 != RAVI_TNUMFLT) || (rVar25 != RAVI_TNUMINT)) {
            if ((rVar21 != RAVI_TNUMINT) || (rVar25 != RAVI_TNUMFLT)) {
              rVar21 = rVar21 ^ RAVI_TNUMINT;
              rVar25 = rVar25 ^ RAVI_TNUMINT;
              oVar23 = oVar22 + op_addfi;
              goto LAB_0011a96d;
            }
            oVar23 = oVar22 + op_addff;
            goto LAB_0011a9ce;
          }
          goto LAB_0011a9cb;
        }
      }
LAB_0011a9bc:
      oVar23 = oVar22 + op_ret;
    }
    else if (oVar22 < op_leii) {
      uVar26 = (ulong)oVar22;
      if ((0x2aa00000UL >> (uVar26 & 0x3f) & 1) == 0) {
        if ((0x2480000000U >> (uVar26 & 0x3f) & 1) == 0) {
          if (uVar26 == 0xf) goto LAB_0011a9b1;
          goto LAB_0011a9ce;
        }
        if ((rVar21 == RAVI_TNUMINT) && (rVar25 == RAVI_TNUMINT)) goto LAB_0011a9bc;
        rVar21 = rVar21 ^ RAVI_TNUMFLT;
        rVar25 = rVar25 ^ RAVI_TNUMFLT;
        oVar23 = oVar22 + op_add;
LAB_0011a96d:
        rVar25 = rVar25 | rVar21;
LAB_0011a9a4:
        if (rVar25 != ~RAVI_TANY) {
          oVar23 = oVar22;
        }
      }
      else {
        oVar23 = oVar22 + (rVar25 == RAVI_TNUMINT && rVar21 == RAVI_TNUMINT);
      }
    }
LAB_0011a9ce:
    create_binary_instruction(proc,oVar23,pPVar11,pPVar10,target,expr->line_number);
    free_temp_pseudo(proc,pPVar11,false);
    free_temp_pseudo(proc,pPVar10,false);
    if (op_00 == BINOPR_NE) {
      linearize_negate_condition(proc,expr->line_number,target,pPVar13);
      target = pPVar13;
    }
    break;
  case EXPR_FUNCTION:
    target = linearize_function_expr(proc,expr);
    break;
  case EXPR_TABLE_LITERAL:
    target = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
    rVar24 = (expr->field_2).common_expr.type.type_code;
    uVar18 = expr->line_number;
    pCVar4 = proc->linearizer->compiler_state->allocator;
    pcVar12 = (char *)(*pCVar4->calloc)(pCVar4->arena,1,0x28);
    cVar17 = '<';
    if (rVar24 != RAVI_TARRAYINT) {
      cVar17 = (rVar24 == RAVI_TARRAYFLT) * '\x02' + ';';
    }
    *pcVar12 = cVar17;
    *(uint *)(pcVar12 + 0x20) = uVar18;
    if (((undefined1  [48])*target & (undefined1  [48])0xf) == (undefined1  [48])0xe)
    goto LAB_0011aa4a;
    raviX_ptrlist_add((PtrList **)(pcVar12 + 0x10),target,
                      proc->linearizer->compiler_state->allocator);
    if (*(BasicBlock **)(pcVar12 + 0x18) != proc->current_bb &&
        *(BasicBlock **)(pcVar12 + 0x18) != (BasicBlock *)0x0) goto LAB_0011aa69;
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,pcVar12,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(pcVar12 + 0x18) = proc->current_bb;
    local_bc = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr);
    raviX_ptrlist_forward_iterator(local_98,(PtrList *)(expr->field_2).function_stmt.function_expr);
    pvVar6 = raviX_ptrlist_iter_next(local_98);
    if (pvVar6 != (void *)0x0) {
      local_ac = 1;
      do {
        local_bc = local_bc + -1;
        rVar24 = (expr->field_2).common_expr.type.type_code;
        pAVar9 = *(AstNode **)((long)pvVar6 + 0x20);
        if (pAVar9 == (AstNode *)0x0) {
          local_a8.type = 8;
          local_a8.index = 0;
          local_a8.field_2 = (anon_union_8_3_4e90b7ae_for_Constant_2)(long)local_ac;
          local_ac = local_ac + 1;
          pCVar7 = add_constant(proc,&local_a8);
          pCVar4 = proc->linearizer->compiler_state->allocator;
          pPVar13 = (Pseudo *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
          uVar18 = *(uint *)pPVar13;
          iVar1 = 8;
          *(uint *)pPVar13 = uVar18 & 0xfffffff0 | 5;
          (pPVar13->field_3).constant = pCVar7;
          *(uint *)pPVar13 = uVar18 & 0xfff00000 | 5 | (uint)pCVar7->index << 4;
        }
        else {
          pPVar13 = linearize_expression(proc,pAVar9);
          iVar1 = *(int *)(*(long *)(*(long *)((long)pvVar6 + 0x20) + 0x20) + 8);
        }
        pPVar10 = linearize_expression(proc,*(AstNode **)((long)pvVar6 + 0x28));
        if (((*(uint *)pPVar10 & 0xf) == 0xb) && (local_bc != 0 || pAVar9 != (AstNode *)0x0)) {
          if ((pPVar10->field_3).range_in_use != 0) goto LAB_0011aa88;
          *(uint *)pPVar10 = *(uint *)pPVar10 & 0xfffffff0 | 4;
        }
        uVar2 = *(undefined4 *)((long)pvVar6 + 4);
        iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x28) + 8);
        if (rVar24 == RAVI_TARRAYFLT) {
          bVar20 = iVar3 == 0x10 | 0x46;
        }
        else if (rVar24 == RAVI_TARRAYINT) {
          bVar20 = iVar3 == 8 | 0x44;
        }
        else {
          cVar17 = (rVar24 == RAVI_TTABLE) * '\x03';
          bVar20 = cVar17 + 0x3e;
          if (iVar1 == 0x101) {
            bVar20 = cVar17 + 0x40;
          }
          else if (iVar1 == 8) {
            bVar20 = cVar17 + 0x3f;
          }
        }
        pCVar4 = proc->linearizer->compiler_state->allocator;
        ptr = (byte *)(*pCVar4->calloc)(pCVar4->arena,1,0x28);
        *ptr = bVar20;
        *(undefined4 *)(ptr + 0x20) = uVar2;
        if (((undefined1  [48])*target & (undefined1  [48])0xf) == (undefined1  [48])0xe)
        goto LAB_0011aa4a;
        raviX_ptrlist_add((PtrList **)(ptr + 0x10),target,
                          proc->linearizer->compiler_state->allocator);
        if (((undefined1  [48])*pPVar13 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
        goto LAB_0011aa4a;
        raviX_ptrlist_add((PtrList **)(ptr + 0x10),pPVar13,
                          proc->linearizer->compiler_state->allocator);
        if (((undefined1  [48])*pPVar10 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
          pPVar14 = indexed_load(proc,pPVar10);
          pPVar11 = pPVar14;
        }
        else {
          pPVar14 = (Pseudo *)0x0;
          pPVar11 = pPVar10;
        }
        raviX_ptrlist_add((PtrList **)(ptr + 8),pPVar11,proc->linearizer->compiler_state->allocator)
        ;
        if (*(BasicBlock **)(ptr + 0x18) != proc->current_bb &&
            *(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) goto LAB_0011aa69;
        raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                          proc->linearizer->compiler_state->allocator);
        *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
        if (pPVar14 != (Pseudo *)0x0) {
          free_temp_pseudo(proc,pPVar14,false);
        }
        free_temp_pseudo(proc,pPVar13,false);
        free_temp_pseudo(proc,pPVar10,false);
        pvVar6 = raviX_ptrlist_iter_next(local_98);
      } while (pvVar6 != (void *)0x0);
    }
    goto LAB_0011a3a5;
  case EXPR_CONCAT:
    target = linearize_concat_expression(proc,expr);
    break;
  case EXPR_BUILTIN:
    if ((expr->field_2).unary_expr.unary_op != 0x111) {
      pLVar16 = proc->linearizer;
      goto LAB_0011aaf9;
    }
    uVar18 = expr->line_number;
    pCVar4 = proc->linearizer->compiler_state->allocator;
    puVar5 = (undefined1 *)(*pCVar4->calloc)(pCVar4->arena,1,0x28);
    *puVar5 = 0x5f;
    *(uint *)(puVar5 + 0x20) = uVar18;
    target = allocate_temp_pseudo(proc,RAVI_TUSERDATA,true);
    pPVar11 = (Pseudo *)0x0;
    pvVar6 = raviX_ptrlist_nth_entry((PtrList *)(expr->field_2).function_stmt.function_expr,0);
    local_98[0].__list = *(PtrList **)((long)pvVar6 + 0x20);
    local_98[0].__head._0_4_ = 0x101;
    pCVar7 = add_constant(proc,(Constant *)local_98);
    pCVar4 = proc->linearizer->compiler_state->allocator;
    puVar8 = (uint *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
    uVar18 = *puVar8;
    *puVar8 = uVar18 & 0xfffffff0 | 5;
    *(Constant **)(puVar8 + 2) = pCVar7;
    *puVar8 = uVar18 & 0xfff00000 | 5 | (uint)pCVar7->index << 4;
    raviX_ptrlist_add((PtrList **)(puVar5 + 8),puVar8,proc->linearizer->compiler_state->allocator);
    pAVar9 = (AstNode *)
             raviX_ptrlist_nth_entry((PtrList *)(expr->field_2).function_stmt.function_expr,1);
    pPVar10 = linearize_expression(proc,pAVar9);
    pPVar13 = pPVar10;
    if (((undefined1  [48])*pPVar10 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pPVar11 = indexed_load(proc,pPVar10);
      pPVar13 = pPVar11;
    }
    raviX_ptrlist_add((PtrList **)(puVar5 + 8),pPVar13,proc->linearizer->compiler_state->allocator);
    if (((undefined1  [48])*target & (undefined1  [48])0xf) == (undefined1  [48])0xe)
    goto LAB_0011aa4a;
    raviX_ptrlist_add((PtrList **)(puVar5 + 0x10),target,proc->linearizer->compiler_state->allocator
                     );
    if (*(BasicBlock **)(puVar5 + 0x18) != proc->current_bb &&
        *(BasicBlock **)(puVar5 + 0x18) != (BasicBlock *)0x0) goto LAB_0011aa69;
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,puVar5,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(puVar5 + 0x18) = proc->current_bb;
    free_temp_pseudo(proc,pPVar10,false);
    goto LAB_0011a822;
  }
  if (target == (Pseudo *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x7e3,"Pseudo *linearize_expression(Proc *, AstNode *)");
  }
LAB_0011a3a5:
  check_pseudo_is_top(proc,target);
  if (((*(uint *)target & 0xf) == 0xb) && (((expr->field_2).embedded_C_stmt.is_decl & 1U) != 0)) {
    if ((target->field_3).range_in_use != 0) {
LAB_0011aa88:
      __assert_fail("pseudo->range_in_use == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x24a,"Pseudo *convert_range_to_temp(Pseudo *)");
    }
    *(uint *)target = *(uint *)target & 0xfffffff0 | 4;
  }
  return target;
}

Assistant:

static Pseudo *linearize_expression(Proc *proc, AstNode *expr)
{
	Pseudo *result = NULL;
	switch (expr->type) {
	case EXPR_LITERAL: {
		result = linearize_literal(proc, expr);
	} break;
	case EXPR_BINARY: {
		result = linearize_binary_operator(proc, expr);
	} break;
	case EXPR_FUNCTION: {
		result = linearize_function_expr(proc, expr);
	} break;
	case EXPR_UNARY: {
		result = linearize_unary_operator(proc, expr);
	} break;
	case EXPR_SUFFIXED: {
		result = linearize_suffixedexpr(proc, expr);
	} break;
	case EXPR_SYMBOL: {
		result = linearize_symbol_expression(proc, expr);
	} break;
	case EXPR_TABLE_LITERAL: {
		result = linearize_table_constructor(proc, expr);
	} break;
	case EXPR_Y_INDEX:
	case EXPR_FIELD_SELECTOR: {
		result = linearize_expression(proc, expr->index_expr.expr);
	} break;
	case EXPR_CONCAT: {
		result = linearize_concat_expression(proc, expr);
	} break;
	case EXPR_BUILTIN: {
		result = linearize_builtin_expression(proc, expr);
	} break;
	default:
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		break;
	}
	assert(result);
	check_pseudo_is_top(proc, result);
	if (result->type == PSEUDO_RANGE && expr->common_expr.truncate_results) {
		// Need to truncate the results to 1
		return convert_range_to_temp(result);
	}
	return result;
}